

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

size_t vkt::api::anon_unknown_1::
       computeSystemMemoryUsage<vkt::api::(anonymous_namespace)::CommandPool>
                 (Context *context,Parameters *params)

{
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  deUint32 queueFamilyIndex_;
  VkAllocationCallbacks *pVVar1;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  size_t sVar2;
  size_t totalMemoryUsage;
  RefData<vk::Handle<(vk::HandleType)24>_> local_108;
  undefined1 local_e8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> obj;
  size_t resourceMemoryUsage;
  Resources res;
  undefined1 local_b0 [8];
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  Parameters *params_local;
  Context *context_local;
  
  pVVar1 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&env.maxResourceConsumers,pVVar1,0x400);
  vkp_ = Context::getPlatformInterface(context);
  vkd_ = Context::getDeviceInterface(context);
  device_ = Context::getDevice(context);
  queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex(context);
  programBinaries_ = Context::getBinaryCollection(context);
  pVVar1 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)&env.maxResourceConsumers)
  ;
  Environment::Environment
            ((Environment *)local_b0,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar1,1);
  CommandPool::Resources::Resources
            ((Resources *)((long)&resourceMemoryUsage + 3),(Environment *)local_b0,params);
  obj.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)&env.maxResourceConsumers);
  CommandPool::create((Move<vk::Handle<(vk::HandleType)24>_> *)&totalMemoryUsage,
                      (Environment *)local_b0,(Resources *)((long)&resourceMemoryUsage + 3),params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_108,(Move *)&totalMemoryUsage);
  data.deleter.m_deviceIface._0_4_ = (int)local_108.deleter.m_deviceIface;
  data.object.m_internal = local_108.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_108.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_108.deleter.m_device;
  data.deleter.m_allocator = local_108.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_e8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&totalMemoryUsage);
  sVar2 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)&env.maxResourceConsumers);
  sVar2 = sVar2 - (long)obj.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                        m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_e8);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&env.maxResourceConsumers);
  return sVar2;
}

Assistant:

size_t computeSystemMemoryUsage (Context& context, const typename Object::Parameters& params)
{
	AllocationCallbackRecorder			allocRecorder		(getSystemAllocator());
	const Environment					env					(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 allocRecorder.getCallbacks(),
															 1u);
	const typename Object::Resources	res					(env, params);
	const size_t						resourceMemoryUsage	= getCurrentSystemMemoryUsage(allocRecorder);

	{
		Unique<typename Object::Type>	obj					(Object::create(env, res, params));
		const size_t					totalMemoryUsage	= getCurrentSystemMemoryUsage(allocRecorder);

		return totalMemoryUsage - resourceMemoryUsage;
	}
}